

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_Class_Type::make(Fl_Class_Type *this)

{
  int iVar1;
  Fl_Class_Type *this_00;
  bool bVar2;
  Fl_Class_Type *o;
  Fl_Type *p;
  Fl_Class_Type *this_local;
  
  o = (Fl_Class_Type *)Fl_Type::current;
  while( true ) {
    bVar2 = false;
    if (o != (Fl_Class_Type *)0x0) {
      iVar1 = (*(o->super_Fl_Type)._vptr_Fl_Type[0x24])();
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    o = (Fl_Class_Type *)(o->super_Fl_Type).parent;
  }
  this_00 = (Fl_Class_Type *)operator_new(0x98);
  Fl_Class_Type(this_00);
  Fl_Type::name((Fl_Type *)this_00,"UserInterface");
  this_00->class_prefix = (char *)0x0;
  this_00->subclass_of = (char *)0x0;
  this_00->public_ = '\x01';
  Fl_Type::add((Fl_Type *)this_00,&o->super_Fl_Type);
  (this_00->super_Fl_Type).factory = &this->super_Fl_Type;
  return &this_00->super_Fl_Type;
}

Assistant:

Fl_Type *Fl_Class_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_decl_block()) p = p->parent;
  Fl_Class_Type *o = new Fl_Class_Type();
  o->name("UserInterface");
  o->class_prefix=0;
  o->subclass_of = 0;
  o->public_ = 1;
  o->add(p);
  o->factory = this;
  return o;
}